

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O0

void __thiscall FxConstant::FxConstant(FxConstant *this,FString *str,FScriptPosition *pos)

{
  ExpVal local_40 [2];
  FScriptPosition *local_20;
  FScriptPosition *pos_local;
  FString *str_local;
  FxConstant *this_local;
  
  local_20 = pos;
  pos_local = (FScriptPosition *)str;
  str_local = (FString *)this;
  FxExpression::FxExpression(&this->super_FxExpression,EFX_Constant,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_00a0ba60;
  ExpVal::ExpVal(&this->value);
  (this->super_FxExpression).ValueType = (PType *)TypeString;
  ExpVal::ExpVal(local_40,&pos_local->FileName);
  ExpVal::operator=(&this->value,local_40);
  ExpVal::~ExpVal(local_40);
  (this->super_FxExpression).isresolved = true;
  return;
}

Assistant:

FxConstant(const FString &str, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		ValueType = TypeString;
		value = ExpVal(str);
		isresolved = true;
	}